

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOOLEAN.c
# Opt level: O1

asn_dec_rval_t
BOOLEAN_decode_uper(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
                   asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  uint uVar1;
  uint *puVar2;
  size_t sVar3;
  undefined8 uVar4;
  asn_dec_rval_t aVar5;
  
  puVar2 = (uint *)*sptr;
  if (puVar2 == (uint *)0x0) {
    puVar2 = (uint *)malloc(4);
    *sptr = puVar2;
    if (puVar2 == (uint *)0x0) {
      uVar4 = 2;
      sVar3 = 0;
      goto LAB_0013fdb7;
    }
  }
  uVar4 = 1;
  uVar1 = per_get_few_bits(pd,1);
  sVar3 = 0;
  if (uVar1 < 2) {
    *puVar2 = uVar1;
    sVar3 = 1;
    uVar4 = 0;
  }
LAB_0013fdb7:
  aVar5.consumed = sVar3;
  aVar5._0_8_ = uVar4;
  return aVar5;
}

Assistant:

asn_dec_rval_t
BOOLEAN_decode_uper(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {
	asn_dec_rval_t rv;
	BOOLEAN_t *st = (BOOLEAN_t *)*sptr;

	(void)opt_codec_ctx;
	(void)constraints;

	if(!st) {
		st = (BOOLEAN_t *)(*sptr = MALLOC(sizeof(*st)));
		if(!st) ASN__DECODE_FAILED;
	}

	/*
	 * Extract a single bit
	 */
	switch(per_get_few_bits(pd, 1)) {
	case 1: *st = 1; break;
	case 0: *st = 0; break;
	case -1: default: ASN__DECODE_STARVED;
	}

	ASN_DEBUG("%s decoded as %s", td->name, *st ? "TRUE" : "FALSE");

	rv.code = RC_OK;
	rv.consumed = 1;
	return rv;
}